

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SdfAnnotateTask::~SdfAnnotateTask(SdfAnnotateTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~SdfAnnotateTask((SdfAnnotateTask *)0x9403e8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SdfAnnotateTask() : SystemTaskBase(KnownSystemName::SdfAnnotate) {}